

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<MaterialDataV>::Resize(TPZVec<MaterialDataV> *this,int64_t newsize)

{
  long *plVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  int64_t *piVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  MaterialDataV *pMVar11;
  TPZManVector<double,_10> *this_00;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pMVar11 = this->fStore;
      if (pMVar11 != (MaterialDataV *)0x0) {
        dVar2 = pMVar11[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
        if (dVar2 != 0.0) {
          lVar8 = (long)dVar2 * 0x98;
          do {
            TPZManVector<double,_10>::~TPZManVector
                      ((TPZManVector<double,_10> *)((long)pMVar11 + lVar8 + -0x70));
            plVar7 = (long *)((long)pMVar11 + lVar8 + -0x80);
            plVar1 = *(long **)((long)pMVar11 + lVar8 + -0x90);
            if (plVar7 != plVar1) {
              operator_delete(plVar1,*plVar7 + 1);
            }
            lVar8 = lVar8 + -0x98;
          } while (lVar8 != 0);
        }
        operator_delete__(pMVar11[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                          (long)dVar2 * 0x98 + 8);
      }
      this->fStore = (MaterialDataV *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar5 = SUB168(auVar3 * ZEXT816(0x98),0);
      uVar10 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar10 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x98),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      piVar6 = (int64_t *)operator_new__(uVar10);
      *piVar6 = newsize;
      lVar8 = 0;
      pMVar11 = (MaterialDataV *)(piVar6 + 1);
      do {
        MaterialDataV::MaterialDataV(pMVar11);
        lVar8 = lVar8 + -0x98;
        pMVar11 = pMVar11 + 1;
      } while (newsize * -0x98 - lVar8 != 0);
      lVar8 = this->fNElements;
      if (newsize <= lVar8) {
        lVar8 = newsize;
      }
      if (0 < lVar8) {
        this_00 = (TPZManVector<double,_10> *)(piVar6 + 6);
        lVar9 = 0x28;
        do {
          pMVar11 = this->fStore;
          *(undefined4 *)(this_00[-1].fExtAlloc + 5) =
               *(undefined4 *)
                ((long)(pMVar11->fProperties).super_TPZManVector<double,_10>.fExtAlloc +
                lVar9 + -0x70);
          std::__cxx11::string::_M_assign((string *)(this_00[-1].fExtAlloc + 6));
          TPZManVector<double,_10>::operator=
                    (this_00,(TPZManVector<double,_10> *)
                             ((long)(pMVar11->fProperties).super_TPZManVector<double,_10>.fExtAlloc
                             + lVar9 + -0x48));
          this_00 = (TPZManVector<double,_10> *)(this_00[1].fExtAlloc + 1);
          lVar9 = lVar9 + 0x98;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      pMVar11 = this->fStore;
      if (pMVar11 != (MaterialDataV *)0x0) {
        dVar2 = pMVar11[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
        if (dVar2 != 0.0) {
          lVar8 = (long)dVar2 * 0x98;
          do {
            TPZManVector<double,_10>::~TPZManVector
                      ((TPZManVector<double,_10> *)((long)pMVar11 + lVar8 + -0x70));
            plVar1 = (long *)((long)pMVar11 + lVar8 + -0x80);
            plVar7 = *(long **)((long)pMVar11 + lVar8 + -0x90);
            if (plVar1 != plVar7) {
              operator_delete(plVar7,*plVar1 + 1);
            }
            lVar8 = lVar8 + -0x98;
          } while (lVar8 != 0);
        }
        operator_delete__(pMVar11[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                          (long)dVar2 * 0x98 + 8);
      }
      this->fStore = (MaterialDataV *)(piVar6 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}